

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraHot.c
# Opt level: O1

void Fra_OneHotAddKnownConstraint(Fra_Man_t *p,Vec_Ptr_t *vOnehots)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  void *pvVar6;
  void *pvVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int pLits [2];
  int local_48;
  int local_44;
  Vec_Ptr_t *local_40;
  long local_38;
  
  if (0 < vOnehots->nSize) {
    local_38 = 0;
    local_40 = vOnehots;
    do {
      pvVar3 = local_40->pArray[local_38];
      if (0 < *(int *)((long)pvVar3 + 4)) {
        lVar9 = 1;
        lVar11 = 0;
        do {
          lVar10 = lVar11 + 1;
          if ((int)lVar10 < *(int *)((long)pvVar3 + 4)) {
            uVar1 = *(uint *)(*(long *)((long)pvVar3 + 8) + lVar11 * 4);
            lVar11 = lVar9;
            if ((int)uVar1 < 0) {
LAB_005fa99e:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            do {
              pVVar4 = p->pManFraig->vCis;
              iVar8 = pVVar4->nSize;
              if (iVar8 <= (int)uVar1) goto LAB_005fa99e;
              uVar2 = *(uint *)(*(long *)((long)pvVar3 + 8) + lVar11 * 4);
              if (((int)uVar2 < 0) || (iVar8 <= (int)uVar2)) goto LAB_005fa99e;
              ppvVar5 = pVVar4->pArray;
              pvVar6 = ppvVar5[uVar1];
              pvVar7 = ppvVar5[uVar2];
              local_48 = *(int *)(*(long *)(*(long *)((long)pvVar6 + 0x28) + 0x98) +
                                 (long)*(int *)((long)pvVar6 + 0x24) * 4) * 2 + 1;
              local_44 = *(int *)(*(long *)(*(long *)((long)pvVar7 + 0x28) + 0x98) +
                                 (long)*(int *)((long)pvVar7 + 0x24) * 4) * 2 + 1;
              iVar8 = sat_solver_addclause(p->pSat,&local_48,(lit *)&local_40);
              if (iVar8 == 0) {
                puts("Fra_OneHotAddKnownConstraint(): Adding clause makes SAT solver unsat.");
                sat_solver_delete(p->pSat);
                p->pSat = (sat_solver *)0x0;
                return;
              }
              lVar11 = lVar11 + 1;
            } while ((int)lVar11 < *(int *)((long)pvVar3 + 4));
          }
          lVar9 = lVar9 + 1;
          lVar11 = lVar10;
        } while (lVar10 < *(int *)((long)pvVar3 + 4));
      }
      local_38 = local_38 + 1;
    } while (local_38 < local_40->nSize);
  }
  return;
}

Assistant:

void Fra_OneHotAddKnownConstraint( Fra_Man_t * p, Vec_Ptr_t * vOnehots )
{
    Vec_Int_t * vGroup;
    Aig_Obj_t * pObj1, * pObj2;
    int k, i, j, Out1, Out2, pLits[2];
    //
    // these constrants should be added to different timeframes!
    // (also note that PIs follow first - then registers)
    //
    Vec_PtrForEachEntry( Vec_Int_t *, vOnehots, vGroup, k )
    {
        Vec_IntForEachEntry( vGroup, Out1, i )
        Vec_IntForEachEntryStart( vGroup, Out2, j, i+1 )
        {
            pObj1 = Aig_ManCi( p->pManFraig, Out1 );
            pObj2 = Aig_ManCi( p->pManFraig, Out2 );
            pLits[0] = toLitCond( Fra_ObjSatNum(pObj1), 1 );
            pLits[1] = toLitCond( Fra_ObjSatNum(pObj2), 1 );
            // add constraint to solver
            if ( !sat_solver_addclause( p->pSat, pLits, pLits + 2 ) )
            {
                printf( "Fra_OneHotAddKnownConstraint(): Adding clause makes SAT solver unsat.\n" );
                sat_solver_delete( p->pSat );
                p->pSat = NULL;
                return;
            }
        }
    }
}